

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O1

void * decodeHex(char *src,int *size)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  char cVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  
  sVar3 = strlen(src);
  iVar6 = (int)(((uint)(sVar3 >> 0x1f) & 1) + (int)sVar3) >> 1;
  *size = iVar6;
  pvVar4 = malloc((long)iVar6);
  if (1 < (int)sVar3) {
    iVar6 = iVar6 + 1;
    lVar7 = 0;
    do {
      iVar2 = tolower((int)src[lVar7 * 2]);
      iVar8 = iVar2 + -0x57;
      if ((char)iVar2 < 'a') {
        iVar8 = iVar2 + -0x30;
      }
      iVar2 = tolower((int)src[lVar7 * 2 + 1]);
      cVar1 = (char)iVar2;
      cVar5 = cVar1 + -0x57;
      if (cVar1 < 'a') {
        cVar5 = cVar1 + -0x30;
      }
      *(char *)((long)pvVar4 + lVar7) = cVar5 + (char)(iVar8 << 4);
      iVar6 = iVar6 + -1;
      lVar7 = lVar7 + 1;
    } while (1 < iVar6);
  }
  return pvVar4;
}

Assistant:

static void *decodeHex( const char *src, int &size ) {
  size = (int) strlen( src )/2;
  unsigned char *data = (unsigned char*)malloc( size ), *d = data;
  const char *s = src;
  for ( int i=size; i>0; i-- ) {
    int v;
    char x = tolower(*s++);
    if ( x >= 'a' ) v = x-'a'+10; else v = x-'0';
    v = v<<4;
    x = tolower(*s++);
    if ( x >= 'a' ) v += x-'a'+10; else v += x-'0';
    *d++ = (uchar)v;
  }
  return (void*)data;
}